

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O3

void __thiscall CSR::turntoCSR(CSR *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  void *__s;
  void *__s_00;
  void *__s_01;
  void *__s_02;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong __n;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  lVar12 = (long)this->row;
  uVar13 = lVar12 * 4;
  if (lVar12 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar13);
  memset(__s,0,uVar13);
  uVar13 = lVar12 * 4 + 4;
  if (lVar12 < -1) {
    uVar13 = 0xffffffffffffffff;
  }
  __s_00 = operator_new__(uVar13);
  memset(__s_00,0,uVar13);
  lVar12 = (long)this->nonzero;
  uVar13 = lVar12 * 4;
  if (lVar12 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  __n = lVar12 * 8;
  if (lVar12 < 0) {
    __n = 0xffffffffffffffff;
  }
  __s_01 = operator_new__(uVar13);
  memset(__s_01,0,uVar13);
  __s_02 = operator_new__(__n);
  memset(__s_02,0,__n);
  lVar12 = std::chrono::_V2::system_clock::now();
  iVar2 = this->nonzero;
  if (0 < (long)iVar2) {
    piVar4 = this->idx;
    lVar8 = 0;
    do {
      piVar1 = (int *)((long)__s + (long)piVar4[lVar8] * 4);
      *piVar1 = *piVar1 + 1;
      lVar8 = lVar8 + 1;
    } while (iVar2 != lVar8);
  }
  lVar8 = (long)this->row;
  if (0 < lVar8) {
    lVar7 = 0;
    iVar10 = 0;
    do {
      *(int *)((long)__s_00 + lVar7 * 4) = iVar10;
      iVar10 = iVar10 + *(int *)((long)__s + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  *(int *)((long)__s_00 + lVar8 * 4) = iVar2;
  memset(__s,0,lVar8 << 2);
  iVar2 = this->col;
  if (0 < (long)iVar2) {
    pdVar5 = this->val;
    piVar4 = this->ptr;
    piVar1 = this->idx;
    lVar8 = 0;
    iVar10 = *piVar4;
    do {
      iVar3 = piVar4[lVar8 + 1];
      if (iVar10 < iVar3) {
        lVar7 = (long)iVar10;
        do {
          lVar11 = (long)piVar1[lVar7];
          iVar10 = *(int *)((long)__s + lVar11 * 4);
          lVar9 = (long)*(int *)((long)__s_00 + lVar11 * 4) + (long)iVar10;
          *(int *)((long)__s_01 + lVar9 * 4) = (int)lVar8;
          *(double *)((long)__s_02 + lVar9 * 8) = pdVar5[lVar7];
          *(int *)((long)__s + lVar11 * 4) = iVar10 + 1;
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar3);
      }
      lVar8 = lVar8 + 1;
      iVar10 = iVar3;
    } while (lVar8 != iVar2);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"execution time (turn to CSR2):",0x1e);
  poVar6 = std::ostream::_M_insert<double>((double)(lVar8 - lVar12) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (-1 < this->row) {
    piVar4 = this->ptr;
    lVar12 = -1;
    do {
      piVar4[lVar12 + 1] = *(int *)((long)__s_00 + lVar12 * 4 + 4);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->row);
  }
  iVar2 = this->nonzero;
  if (0 < (long)iVar2) {
    pdVar5 = this->val;
    lVar12 = 0;
    do {
      pdVar5[lVar12] = *(double *)((long)__s_02 + lVar12 * 8);
      lVar12 = lVar12 + 1;
    } while (iVar2 != lVar12);
    if (0 < iVar2) {
      piVar4 = this->idx;
      lVar12 = 0;
      do {
        piVar4[lVar12] = *(int *)((long)__s_01 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 < this->nonzero);
    }
  }
  operator_delete__(__s);
  operator_delete__(__s_01);
  operator_delete__(__s_00);
  operator_delete__(__s_02);
  return;
}

Assistant:

void  CSR::turntoCSR()
{
    int *rowCnt= new int [row]();
    int *ptrR = new int[row+1]();
    int counter = 0;
    int *colIdx = new int[nonzero]();
    double *valR = new double [nonzero]();

    //
  //  int *idxR = new int[nonzero]();
  //
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    for(int i=0; i<nonzero; i++)
    {
        rowCnt[idx[i]]++;
    }
    for(int i=0; i<row; i++)
    {
        ptrR[i] = counter;
        counter += rowCnt[i];
    }
    ptrR[row] = nonzero;
    memset(rowCnt, 0, sizeof(int) * row);//makes zero all elements of rowCtn
    for(int i=0; i<col; i++)
    {
        for(int j= ptr[i]; j<ptr[i+1]; j++)
        {
           int r = idx[j];
           int index = rowCnt[r]+ptrR[r];
           colIdx[index] = i;
           valR[index] = val[j];
           rowCnt[r]++;
        }
    }
    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym1 = elapsed_seconds.count();
    cout << "execution time (turn to CSR2):" << durationSym1 << "\n";

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = ptrR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = valR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = colIdx[i];
    }

    delete []rowCnt;
    delete []colIdx;
    delete []ptrR;
    delete []valR;
}